

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmatchQbf.cpp
# Opt level: O0

void Bmatch_Construct_MUXes
               (vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_> *Pi_Pool,Abc_Obj_t **pObj2,
               Abc_Ntk_t **pNtk_Qbf,int *level,int *fForPi)

{
  Abc_Aig_t *pAVar1;
  size_type sVar2;
  char *pcVar3;
  Abc_Obj_t *pAVar4;
  char *pcVar5;
  reference ppAVar6;
  Abc_Obj_t *pAVar7;
  int local_78;
  int i;
  char *local_68;
  char *pName;
  char *pSuffix;
  Abc_Obj_t *pObjA;
  Abc_Obj_t *pObj;
  vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_> new_Pi_Pool;
  int *fForPi_local;
  int *level_local;
  Abc_Ntk_t **pNtk_Qbf_local;
  Abc_Obj_t **pObj2_local;
  vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_> *Pi_Pool_local;
  
  new_Pi_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)fForPi;
  std::vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>::vector
            ((vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_> *)&pObj);
  sVar2 = std::vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>::size(Pi_Pool);
  if (sVar2 != 0) {
    sVar2 = std::vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>::size(Pi_Pool);
    if (sVar2 < 2) {
      ppAVar6 = std::vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>::operator[](Pi_Pool,0);
      pObjA = *ppAVar6;
      if (*(int *)new_Pi_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage == 1) {
        pAVar4 = Abc_NtkCreatePi(*pNtk_Qbf);
        if (*(int *)new_Pi_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage == 1) {
          local_68 = "x_";
        }
        else {
          local_68 = "y_";
        }
        pcVar3 = Abc_ObjName(*pObj2);
        pcVar3 = Bmatch_NameAddPrefix(local_68,2,pcVar3);
        Abc_ObjAssignName(pAVar4,pcVar3,"_*");
        if (pcVar3 != (char *)0x0) {
          operator_delete(pcVar3,1);
        }
        pAVar1 = (Abc_Aig_t *)(*pNtk_Qbf)->pManFunc;
        pAVar7 = Abc_AigConst1(*pNtk_Qbf);
        pAVar7 = Abc_ObjNot(pAVar7);
        ppAVar6 = std::vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>::operator[](Pi_Pool,0);
        pObjA = Abc_AigMux(pAVar1,pAVar4,pAVar7,*ppAVar6);
      }
      pAVar4 = Abc_NtkCreatePi(*pNtk_Qbf);
      if (*(int *)new_Pi_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage == 1) {
        local_68 = "x_";
      }
      else {
        local_68 = "y_";
      }
      pcVar3 = Abc_ObjName(*pObj2);
      pcVar3 = Bmatch_NameAddPrefix(local_68,2,pcVar3);
      Abc_ObjAssignName(pAVar4,pcVar3,"_0");
      if (pcVar3 != (char *)0x0) {
        operator_delete(pcVar3,1);
      }
      pAVar1 = (Abc_Aig_t *)(*pNtk_Qbf)->pManFunc;
      pAVar7 = Abc_ObjNot(pObjA);
      pObjA = Abc_AigMux(pAVar1,pAVar4,pAVar7,pObjA);
      ((*pObj2)->field_6).pCopy = pObjA;
    }
    else {
      pcVar3 = (char *)operator_new__(10);
      sprintf(pcVar3,"_%d",(ulong)(uint)*level);
      *level = *level + 1;
      pAVar4 = Abc_NtkCreatePi(*pNtk_Qbf);
      if (*(int *)new_Pi_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage == 1) {
        local_68 = "x_";
      }
      else {
        local_68 = "y_";
      }
      pcVar5 = Abc_ObjName(*pObj2);
      pcVar5 = Bmatch_NameAddPrefix(local_68,2,pcVar5);
      Abc_ObjAssignName(pAVar4,pcVar5,pcVar3);
      if (pcVar5 != (char *)0x0) {
        operator_delete(pcVar5,1);
      }
      local_78 = 0;
      while( true ) {
        sVar2 = std::vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>::size(Pi_Pool);
        if (sVar2 - 1 <= (ulong)(long)local_78) break;
        pAVar1 = (Abc_Aig_t *)(*pNtk_Qbf)->pManFunc;
        ppAVar6 = std::vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>::operator[]
                            (Pi_Pool,(long)(local_78 + 1));
        pAVar7 = *ppAVar6;
        ppAVar6 = std::vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>::operator[]
                            (Pi_Pool,(long)local_78);
        pObjA = Abc_AigMux(pAVar1,pAVar4,pAVar7,*ppAVar6);
        std::vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>::push_back
                  ((vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_> *)&pObj,&pObjA);
        local_78 = local_78 + 2;
      }
      sVar2 = std::vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>::size(Pi_Pool);
      if ((sVar2 & 1) != 0) {
        sVar2 = std::vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>::size(Pi_Pool);
        ppAVar6 = std::vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>::operator[]
                            (Pi_Pool,sVar2 - 1);
        std::vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>::push_back
                  ((vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_> *)&pObj,ppAVar6);
      }
      Bmatch_Construct_MUXes
                ((vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_> *)&pObj,pObj2,pNtk_Qbf,level,
                 (int *)new_Pi_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    std::vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>::~vector
              ((vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_> *)&pObj);
    return;
  }
  __assert_fail("Pi_Pool.size() >= 1",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bmatch/bmatchQbf.cpp"
                ,0x123,
                "void Bmatch_Construct_MUXes(vector<Abc_Obj_t *> &, Abc_Obj_t *&, Abc_Ntk_t *&, int &, int &)"
               );
}

Assistant:

void Bmatch_Construct_MUXes( vector< Abc_Obj_t * > & Pi_Pool, Abc_Obj_t *& pObj2, Abc_Ntk_t *& pNtk_Qbf, int & level, int & fForPi)
{
    vector< Abc_Obj_t * > new_Pi_Pool;
    Abc_Obj_t * pObj, * pObjA;
    char * pSuffix, * pName;

    assert( Pi_Pool.size() >= 1);
    if( Pi_Pool.size() >= 2){
        pSuffix = new char[10];
        sprintf( pSuffix, "_%d", level);
        ++level;

        pObjA = Abc_NtkCreatePi( pNtk_Qbf );

        if( fForPi == 1 ){
        pName = "x_";
        }
        else{
            pName = "y_";
        }
        pName = Bmatch_NameAddPrefix(pName, 2, Abc_ObjName(pObj2));
        Abc_ObjAssignName( pObjA, pName, pSuffix );
        delete pName;

        for( int i = 0; i < Pi_Pool.size() - 1; i = i + 2 ){
            pObj = Abc_AigMux( (Abc_Aig_t * )pNtk_Qbf->pManFunc, pObjA, Pi_Pool[i + 1], Pi_Pool[i] );
            new_Pi_Pool.push_back( pObj );
        }
        if( !(Pi_Pool.size() % 2 == 0) ){
            new_Pi_Pool.push_back( Pi_Pool[ Pi_Pool.size() - 1 ] );
        }
        Bmatch_Construct_MUXes( new_Pi_Pool, pObj2, pNtk_Qbf, level, fForPi );
    }
    else{
        pObj = Pi_Pool[0];
        if( fForPi == 1 ){
            pSuffix = "_*\0";
            pObjA = Abc_NtkCreatePi( pNtk_Qbf );

            if( fForPi == 1 ){
                pName = "x_";
            }
            else{
                pName = "y_";
            }
            pName = Bmatch_NameAddPrefix(pName, 2, Abc_ObjName(pObj2));
            Abc_ObjAssignName( pObjA, pName, pSuffix );
            delete pName;
            
            pObj = Abc_AigMux( (Abc_Aig_t * )pNtk_Qbf->pManFunc, pObjA, Abc_ObjNot(Abc_AigConst1(pNtk_Qbf)), Pi_Pool[0] );
        }
        pSuffix = "_0\0";
        pObjA = Abc_NtkCreatePi( pNtk_Qbf );

        if( fForPi == 1 ){
            pName = "x_";
        }
        else{
            pName = "y_";
        }
        pName = Bmatch_NameAddPrefix(pName, 2, Abc_ObjName(pObj2));
        Abc_ObjAssignName( pObjA, pName, pSuffix );
        delete pName;

        pObj = Abc_AigMux( (Abc_Aig_t * )pNtk_Qbf->pManFunc, pObjA, Abc_ObjNot( pObj ), pObj );
        pObj2->pCopy = pObj;
    }
}